

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PostDecTestInt16(void)

{
  bool expected;
  short t;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  long lVar2;
  allocator local_51;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 4; lVar2 != 0x3a; lVar2 = lVar2 + 6) {
    t = *(short *)(&UNK_0015b02c + lVar2);
    si.m_int = t;
    SVar1 = SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
            operator--(&si,0);
    expected = *(bool *)((long)&dec_int16 + lVar2);
    if ((SVar1.m_int == t) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_int16 throw (2): ",&local_51);
      err_msg<short>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PostDecTestInt16()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int16_t > si(dec_int16[i].x);
			SafeInt< std::int16_t > vv = si--;

			if(vv != dec_int16[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int16[i].fExpected )
		{
			err_msg( "Error in case dec_int16 throw (2): ", dec_int16[i].x, dec_int16[i].fExpected );
		}
	}
}